

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O2

void __thiscall
t_javame_generator::generate_get_struct_desc
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  ostream *poVar1;
  
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"protected TStruct getStructDesc() {");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"  return STRUCT_DESC;");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  poVar1 = t_generator::indent((t_generator *)this,out);
  poVar1 = std::operator<<(poVar1,"}");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_javame_generator::generate_get_struct_desc(ostream& out, t_struct* tstruct) {
  (void)tstruct;
  indent(out) << "protected TStruct getStructDesc() {" << endl;
  indent(out) << "  return STRUCT_DESC;" << endl;
  indent(out) << "}" << endl;
}